

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlOutputBufferPtr
xmlOutputBufferCreateIO
          (xmlOutputWriteCallback iowrite,xmlOutputCloseCallback ioclose,void *ioctx,
          xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr pxVar1;
  
  if (iowrite == (xmlOutputWriteCallback)0x0) {
    xmlCharEncCloseFunc(encoder);
  }
  else {
    pxVar1 = xmlAllocOutputBuffer(encoder);
    if (pxVar1 != (xmlOutputBufferPtr)0x0) {
      pxVar1->context = ioctx;
      pxVar1->writecallback = iowrite;
      pxVar1->closecallback = ioclose;
      return pxVar1;
    }
  }
  return (xmlOutputBufferPtr)0x0;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateIO(xmlOutputWriteCallback   iowrite,
	 xmlOutputCloseCallback  ioclose, void *ioctx,
	 xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (iowrite == NULL) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        ret->context = (void *) ioctx;
	ret->writecallback = iowrite;
	ret->closecallback = ioclose;
    }

    return(ret);
}